

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

int __thiscall
Imf_2_5::TypedAttribute<int>::copy(TypedAttribute<int> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 (*pauVar1) [16];
  Attribute *attribute;
  
  pauVar1 = (undefined1 (*) [16])operator_new(0x10);
  *pauVar1 = (undefined1  [16])0x0;
  TypedAttribute(this);
  (**(code **)(*(long *)*pauVar1 + 0x30))(pauVar1,this);
  return (int)pauVar1;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}